

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_builder.cpp
# Opt level: O2

int __thiscall
ccs::RuleBuilder::Impl::select
          (Impl *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  Child *this_00;
  undefined4 in_register_00000034;
  shared_ptr<ccs::RuleBuilder::Impl> local_40;
  
  this_00 = (Child *)operator_new(0x30);
  std::__shared_ptr<ccs::RuleBuilder::Impl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ccs::RuleBuilder::Impl,void>
            ((__shared_ptr<ccs::RuleBuilder::Impl,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (__weak_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2> *)
             (CONCAT44(in_register_00000034,__nfds) + 8));
  Child::Child(this_00,&local_40,(string *)__readfds,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)__writefds);
  std::__shared_ptr<ccs::RuleBuilder::Impl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ccs::RuleBuilder::Child,void>
            ((__shared_ptr<ccs::RuleBuilder::Impl,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (int)this;
}

Assistant:

std::shared_ptr<RuleBuilder::Impl> RuleBuilder::Impl::select(
    const std::string &name, const std::vector<std::string> &values) {
  return std::shared_ptr<Impl>(new Child(shared_from_this(), name, values));
}